

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix22<float> __thiscall Imath_3_2::Matrix22<float>::inverse(Matrix22<float> *this)

{
  float *pfVar1;
  float *in_RSI;
  Matrix22<float> *in_RDI;
  float a;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Qa [2];
  float extraout_XMM0_Qa_00 [2];
  float afVar5 [2];
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float afVar6 [2];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Matrix22<float> MVar9;
  int j_1;
  int i_1;
  float mr;
  int j;
  int i;
  float r;
  Matrix22<float> s;
  int local_38;
  int local_34;
  int local_2c;
  int local_28;
  Matrix22<float> local_20 [2];
  
  Matrix22(local_20,in_RSI[3],-in_RSI[1],-in_RSI[2],*in_RSI);
  a = *in_RSI * in_RSI[3] + -(in_RSI[2] * in_RSI[1]);
  fVar2 = abs<float>(a);
  auVar7._0_12_ = ZEXT812(0x3f800000);
  auVar7._12_4_ = 0;
  if (fVar2 < 1.0) {
    fVar2 = abs<float>(a);
    fVar3 = std::numeric_limits<float>::min();
    auVar8._4_4_ = extraout_XMM0_Db;
    auVar8._0_4_ = fVar3;
    auVar8._8_4_ = extraout_XMM0_Dc;
    auVar8._12_4_ = extraout_XMM0_Dd;
    for (local_34 = 0; afVar6 = auVar8._0_8_, local_34 < 2; local_34 = local_34 + 1) {
      for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
        pfVar1 = operator[](local_20,local_34);
        fVar4 = abs<float>(pfVar1[local_38]);
        afVar6[1] = extraout_XMM0_Db_00;
        afVar6[0] = fVar4;
        if (fVar2 / fVar3 <= fVar4) {
          Matrix22(in_RDI);
          afVar5 = extraout_XMM0_Qa;
          goto LAB_00184cc7;
        }
        pfVar1 = operator[](local_20,local_34);
        auVar8 = ZEXT416((uint)a);
        pfVar1[local_38] = pfVar1[local_38] / a;
      }
    }
  }
  else {
    for (local_28 = 0; afVar6 = auVar7._0_8_, local_28 < 2; local_28 = local_28 + 1) {
      for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
        pfVar1 = operator[](local_20,local_28);
        auVar7 = ZEXT416((uint)a);
        pfVar1[local_2c] = pfVar1[local_2c] / a;
      }
    }
  }
  Matrix22(in_RDI,local_20);
  afVar5 = extraout_XMM0_Qa_00;
LAB_00184cc7:
  MVar9.x[1][0] = afVar6[0];
  MVar9.x[1][1] = afVar6[1];
  MVar9.x[0][0] = afVar5[0];
  MVar9.x[0][1] = afVar5[1];
  return (Matrix22<float>)MVar9.x;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Matrix22<T>
                 Matrix22<T>::inverse () const IMATH_NOEXCEPT
{
    Matrix22 s (x[1][1], -x[0][1], -x[1][0], x[0][0]);

    T r = x[0][0] * x[1][1] - x[1][0] * x[0][1];

    if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
    {
        for (int i = 0; i < 2; ++i)
        {
            for (int j = 0; j < 2; ++j)
            {
                s[i][j] /= r;
            }
        }
    }
    else
    {
        T mr =
            IMATH_INTERNAL_NAMESPACE::abs (r) / std::numeric_limits<T>::min ();

        for (int i = 0; i < 2; ++i)
        {
            for (int j = 0; j < 2; ++j)
            {
                if (mr > IMATH_INTERNAL_NAMESPACE::abs (s[i][j]))
                {
                    s[i][j] /= r;
                }
                else
                {
                    return Matrix22 ();
                }
            }
        }
    }
    return s;
}